

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression *
slang::ast::Expression::tryBindInterfaceRef
          (ASTContext *context,ExpressionSyntax *syntax,bool isInterfacePort)

{
  SyntaxKind kind;
  SymbolKind SVar1;
  Compilation *compilation;
  InstanceBodySymbol *pIVar2;
  ResolvedConfig *pRVar3;
  ConfigRule *pCVar4;
  DeferredSourceRange sourceRange_00;
  __extent_storage<18446744073709551615UL> _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 this;
  bool bVar10;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *args;
  Symbol *pSVar11;
  Type *pTVar12;
  Diagnostic *pDVar13;
  SyntaxNode *pSVar14;
  InstanceSymbol *pIVar15;
  VirtualInterfaceType *elementType;
  undefined7 in_register_00000011;
  undefined4 uVar16;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *sel
  ;
  LookupResult *pLVar17;
  LookupResult *args_00;
  LookupResult *in_R9;
  char *pcVar18;
  ArbitrarySymbolExpression *pAVar19;
  long lVar20;
  InstanceBodySymbol **ppIVar21;
  string_view arg;
  string_view arg_00;
  string_view sVar22;
  IfaceConn IVar23;
  SourceRange SVar24;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  ModportSymbol *modport;
  SourceRange sourceRange;
  HierarchicalReference hierRef;
  SmallVector<slang::ConstantRange,_4UL> dims;
  LookupResult result;
  InstanceSymbol *local_550;
  char *local_548;
  Symbol *local_540;
  undefined4 local_534;
  LookupResult *local_530;
  SourceRange local_528;
  SyntaxNode *local_518;
  ArbitrarySymbolExpression *local_510;
  HierarchicalReference *local_508;
  undefined1 local_500 [56];
  char local_4c8 [16];
  undefined1 local_4b8 [32];
  size_type local_498;
  size_type local_490;
  undefined1 local_488 [192];
  Element *local_3c8;
  size_type local_3c0;
  pointer local_3b8;
  Element local_3b0 [2];
  SmallVectorBase<slang::Diagnostic> local_370;
  undefined1 local_278 [240];
  SmallVectorBase<slang::ast::HierarchicalReference::Element> local_188;
  SmallVectorBase<slang::Diagnostic> local_130;
  
  uVar16 = (undefined4)CONCAT71(in_register_00000011,isInterfacePort);
  kind = (syntax->super_SyntaxNode).kind;
  pSVar14 = &syntax->super_SyntaxNode;
  while (kind == ParenthesizedExpression) {
    pSVar14 = pSVar14[1].previewNode;
    kind = pSVar14->kind;
  }
  bVar10 = slang::syntax::NameSyntax::isKind(kind);
  if (!bVar10) {
    if (isInterfacePort) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar14);
      ASTContext::addDiag(context,(DiagCode)0x5f0007,SVar24);
    }
    return (Expression *)0x0;
  }
  local_278._24_8_ = local_278 + 0x30;
  local_278._0_8_ = (LookupResult *)0x0;
  local_278._8_5_ = 0;
  local_278._13_3_ = 0;
  local_278._16_4_ = 0;
  local_278[0x14] = 0;
  local_278._32_8_ = (TempVarSymbol *)0x0;
  local_278._40_8_ = (RandomizeDetails *)0x4;
  local_188.data_ = (pointer)local_188.firstElement;
  local_188.len = 0;
  local_188.cap = 2;
  local_130.data_ = (pointer)local_130.firstElement;
  local_130.len = 0;
  local_130.cap = 2;
  args_00 = (LookupResult *)context;
  local_518 = &syntax->super_SyntaxNode;
  Lookup::name((NameSyntax *)pSVar14,context,
               (bitmask<slang::ast::LookupFlags>)((uint)isInterfacePort << 10),
               (LookupResult *)local_278);
  pcVar18 = (char *)0x0;
  pLVar17 = (LookupResult *)0x0;
  pAVar19 = (ArbitrarySymbolExpression *)0x0;
  if ((LookupResult *)local_278._0_8_ == (LookupResult *)0x0) {
    pLVar17 = (LookupResult *)0x0;
    pAVar19 = (ArbitrarySymbolExpression *)0x0;
    pcVar18 = (char *)0x0;
    if (pSVar14->kind == ScopedName) {
      pLVar17 = (LookupResult *)0x0;
      pAVar19 = (ArbitrarySymbolExpression *)0x0;
      pcVar18 = (char *)0x0;
      if (*(short *)&pSVar14[1].parent == 0x19) {
        pLVar17 = (LookupResult *)0x0;
        pAVar19 = (ArbitrarySymbolExpression *)0x0;
        pcVar18 = (char *)0x0;
        if (**(int **)(pSVar14 + 2) == 0xe5) {
          local_4b8._0_8_ = (LookupResult *)0x0;
          local_4b8[8] = '\0';
          local_4b8[9] = '\0';
          local_4b8[10] = '\0';
          local_4b8[0xb] = '\0';
          local_4b8[0xc] = '\0';
          local_4b8[0xd] = '\0';
          local_4b8[0xe] = '\0';
          local_4b8[0xf] = '\0';
          local_4b8._16_4_ = 0;
          local_4b8[0x14] = '\0';
          local_498 = 0;
          local_490 = 4;
          local_3c8 = local_3b0;
          local_3c0 = 0;
          local_3b8 = (pointer)0x2;
          local_370.data_ = (pointer)local_370.firstElement;
          local_370.len = 0;
          local_370.cap = 2;
          args_00 = (LookupResult *)context;
          local_4b8._24_8_ = local_488;
          Lookup::name(*(NameSyntax **)(pSVar14 + 1),context,(bitmask<slang::ast::LookupFlags>)0x0,
                       (LookupResult *)local_4b8);
          sVar22 = parsing::Token::valueText((Token *)(*(long *)(pSVar14 + 2) + 0x18));
          local_548 = sVar22._M_str;
          pLVar17 = (LookupResult *)sVar22._M_len;
          pAVar19 = (ArbitrarySymbolExpression *)0x0;
          if (((LookupResult *)local_4b8._0_8_ != (LookupResult *)0x0) &&
             (pLVar17 != (LookupResult *)0x0)) {
            if ((*(int *)(Symbol **)local_4b8._0_8_ == 0x31) ||
               (*(int *)(Symbol **)local_4b8._0_8_ == 0x2b)) {
              args_00 = (LookupResult *)local_4b8;
              LookupResult::operator=((LookupResult *)local_278,args_00);
              pAVar19 = *(ArbitrarySymbolExpression **)(pSVar14 + 2);
            }
            else {
              pAVar19 = (ArbitrarySymbolExpression *)0x0;
            }
          }
          SmallVectorBase<slang::Diagnostic>::cleanup(&local_370,(EVP_PKEY_CTX *)args_00);
          if (local_3c8 != local_3b0) {
            operator_delete(local_3c8);
          }
          pcVar18 = local_548;
          if ((undefined1 *)local_4b8._24_8_ != local_488) {
            operator_delete((void *)local_4b8._24_8_);
            pcVar18 = local_548;
          }
        }
      }
    }
    if ((LookupResult *)local_278._0_8_ == (LookupResult *)0x0) {
      pLVar17 = args_00;
      if (isInterfacePort) {
        LookupResult::reportDiags((LookupResult *)local_278,context);
        pLVar17 = (LookupResult *)context;
      }
      pAVar19 = (ArbitrarySymbolExpression *)0x0;
      goto LAB_0041169f;
    }
  }
  this = local_278._0_8_;
  compilation = ((context->scope).ptr)->compilation;
  local_550 = (InstanceSymbol *)0x0;
  IVar23.second = (ModportSymbol *)0x0;
  IVar23.first = (Symbol *)local_278._0_8_;
  local_548 = pcVar18;
  local_534 = uVar16;
  local_530 = pLVar17;
  local_510 = pAVar19;
  if (*(int *)(Compilation **)local_278._0_8_ == 0x2b) {
    local_278[0x14] = local_278[0x14] | 0x20;
    args_00 = (LookupResult *)local_278._0_8_;
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
    emplace_back<slang::ast::Symbol_const&>(&local_188,(Symbol *)local_278._0_8_);
    IVar23 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)this);
    local_550 = (InstanceSymbol *)IVar23.second;
    if ((IVar23.first != (Symbol *)0x0) &&
       ((TempVarSymbol *)local_278._32_8_ != (TempVarSymbol *)0x0)) {
      local_4b8[8] = '\0';
      local_4b8[9] = '\0';
      local_4b8[10] = '\0';
      local_4b8[0xb] = '\0';
      local_4b8[0xc] = '\0';
      local_4b8[0xd] = '\0';
      local_4b8[0xe] = '\0';
      local_4b8[0xf] = '\0';
      local_4b8._16_4_ = 5;
      local_4b8[0x14] = '\0';
      local_4b8._21_3_ = 0;
      lVar20 = local_278._32_8_ * 0x30;
      pSVar11 = (Symbol *)local_278._24_8_;
      local_4b8._0_8_ = (LookupResult *)(local_4b8 + 0x18);
      do {
        args = std::
               get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                         ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                           *)pSVar11);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
        emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)local_4b8,args);
        pSVar11 = (Symbol *)&pSVar11->indexInScope;
        lVar20 = lVar20 + -0x30;
      } while (lVar20 != 0);
      selectors._M_ptr._5_3_ = local_4b8._13_3_;
      selectors._M_ptr._0_5_ = local_4b8._8_5_;
      selectors._M_extent._M_extent_value = (size_t)context;
      args_00 = (LookupResult *)local_4b8._0_8_;
      pSVar11 = Lookup::selectChild((Lookup *)IVar23.first,(Symbol *)local_4b8._0_8_,selectors,
                                    (ASTContext *)local_278,in_R9);
      local_278._32_8_ = (TempVarSymbol *)0x0;
      if ((LookupResult *)local_4b8._0_8_ != (LookupResult *)(local_4b8 + 0x18)) {
        operator_delete((void *)local_4b8._0_8_);
      }
      IVar23.second = (ModportSymbol *)local_550;
      IVar23.first = pSVar11;
      pAVar19 = (ArbitrarySymbolExpression *)0x0;
    }
    local_550 = (InstanceSymbol *)IVar23.second;
    if (IVar23.first == (Symbol *)0x0) {
      LookupResult::reportDiags((LookupResult *)local_278,context);
      pLVar17 = (LookupResult *)local_4b8;
      local_4b8._0_8_ = (LookupResult *)0x0;
      pAVar19 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)pLVar17,
                           compilation->errorType);
      goto LAB_0041169f;
    }
  }
  local_540 = IVar23.first;
  local_4b8._0_8_ = local_4b8 + 0x18;
  local_4b8[8] = '\0';
  local_4b8[9] = '\0';
  local_4b8[10] = '\0';
  local_4b8[0xb] = '\0';
  local_4b8[0xc] = '\0';
  local_4b8[0xd] = '\0';
  local_4b8[0xe] = '\0';
  local_4b8[0xf] = '\0';
  local_4b8._16_4_ = 4;
  local_4b8[0x14] = '\0';
  local_4b8._21_3_ = 0;
  pLVar17 = (LookupResult *)local_500;
  while( true ) {
    local_550 = (InstanceSymbol *)IVar23.second;
    pIVar15 = (InstanceSymbol *)IVar23.first;
    SVar1 = (pIVar15->super_InstanceSymbolBase).super_Symbol.kind;
    if (SVar1 != InstanceArray) break;
    if (*(long *)&pIVar15[1].super_InstanceSymbolBase.super_Symbol == 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_500._8_8_;
      local_500._0_16_ = auVar6 << 0x40;
      pAVar19 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)pLVar17,
                           compilation->errorType);
      goto LAB_0041167d;
    }
    args_00 = (LookupResult *)&pIVar15[1].super_InstanceSymbolBase.super_Symbol.name;
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
              ((SmallVectorBase<slang::ConstantRange> *)local_4b8,(ConstantRange *)args_00);
    IVar23.second = (ModportSymbol *)local_550;
    IVar23.first = *(Symbol **)&pIVar15->canonicalBody->super_Symbol;
  }
  if ((SVar1 == Modport) ||
     ((pLVar17 = args_00, SVar1 == Instance &&
      (bVar10 = InstanceSymbol::isInterface(pIVar15), pLVar17 = args_00, bVar10)))) {
    LookupResult::reportDiags((LookupResult *)local_278,context);
    LookupResult::errorIfSelectors((LookupResult *)local_278,context);
    local_528 = slang::syntax::SyntaxNode::sourceRange(local_518);
    if ((pIVar15->super_InstanceSymbolBase).super_Symbol.kind == Modport) {
      ppIVar21 = (InstanceBodySymbol **)
                 &((pIVar15->super_InstanceSymbolBase).super_Symbol.parentScope)->thisSym;
      local_550 = pIVar15;
    }
    else {
      ppIVar21 = &pIVar15->body;
    }
    pIVar2 = *ppIVar21;
    if ((char)local_534 == '\0') {
      if (pIVar2->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) {
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0xab0007,local_528);
        pSVar14 = findOverrideNodeSource(pIVar2->hierarchyOverrideNode);
        if (pSVar14 != (SyntaxNode *)0x0) {
          SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar14);
          Diagnostic::addNote(pDVar13,(DiagCode)0x50001,SVar24);
        }
      }
      if ((pIVar2->parentInstance != (InstanceSymbol *)0x0) &&
         (pIVar2->parentInstance->resolvedConfig != (ResolvedConfig *)0x0)) {
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0xaa0007,local_528);
        pRVar3 = pIVar2->parentInstance->resolvedConfig;
        pCVar4 = pRVar3->configRule;
        if (pCVar4 == (ConfigRule *)0x0) {
          Diagnostic::addNote(pDVar13,(DiagCode)0x40001,(pRVar3->useConfig->super_Symbol).location);
        }
        else {
          SVar24 = slang::syntax::SyntaxNode::sourceRange((pCVar4->syntax).ptr);
          Diagnostic::addNote(pDVar13,(DiagCode)0x40001,SVar24);
        }
      }
    }
    if (local_530 == (LookupResult *)0x0) {
LAB_0041159f:
      local_508 = (HierarchicalReference *)CONCAT71(local_508._1_7_,1);
      local_500._0_8_ = local_528.startLoc;
      elementType = BumpAllocator::
                    emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol_const&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation>
                              (&compilation->super_BumpAllocator,pIVar2->parentInstance,
                               (ModportSymbol **)&local_550,(bool *)&local_508,
                               (SourceLocation *)local_500);
      _Var5._M_extent_value._5_3_ = local_4b8._13_3_;
      _Var5._M_extent_value._0_5_ = local_4b8._8_5_;
      if (_Var5._M_extent_value != 0) {
        local_500._40_8_ = local_528.startLoc;
        local_500._48_8_ = local_528.endLoc;
        local_4c8[0] = '\x01';
        local_4c8[1] = '\0';
        local_4c8[2] = '\0';
        local_4c8[3] = '\0';
        local_4c8[4] = '\0';
        local_4c8[5] = '\0';
        local_4c8[6] = '\0';
        local_4c8[7] = '\0';
        sourceRange_00.node.value = 1;
        sourceRange_00.range = local_528;
        dimensions._M_extent._M_extent_value = _Var5._M_extent_value;
        dimensions._M_ptr = (pointer)local_4b8._0_8_;
        elementType = (VirtualInterfaceType *)
                      FixedSizeUnpackedArrayType::fromDims
                                ((context->scope).ptr,&elementType->super_Type,dimensions,
                                 sourceRange_00);
      }
      if (local_540->kind == Modport) {
        local_540 = (Symbol *)local_540->parentScope->thisSym[1].originatingSyntax;
      }
      HierarchicalReference::fromLookup
                ((HierarchicalReference *)local_500,compilation,(LookupResult *)local_278);
      pLVar17 = (LookupResult *)(context->scope).ptr;
      local_508 = (HierarchicalReference *)local_500;
      pAVar19 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange&>
                          (&compilation->super_BumpAllocator,(Scope *)pLVar17,local_540,
                           &elementType->super_Type,&local_508,&local_528);
    }
    else if (local_550 == (InstanceSymbol *)0x0) {
      sVar22._M_str = local_548;
      sVar22._M_len = (size_t)local_530;
      pLVar17 = local_530;
      pIVar15 = (InstanceSymbol *)Scope::find(&pIVar2->super_Scope,sVar22);
      if ((pIVar15 == (InstanceSymbol *)0x0) ||
         ((pIVar15->super_InstanceSymbolBase).super_Symbol.kind != Modport)) {
        if (local_510 == (ArbitrarySymbolExpression *)0x0 || ((ulong)local_510 & 1) != 0) {
          SVar24 = (SourceRange)ZEXT816(0);
        }
        else {
          SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_510);
        }
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0x22000a,SVar24);
        arg_00._M_str = local_548;
        arg_00._M_len = (size_t)local_530;
        Diagnostic::operator<<(pDVar13,arg_00);
        Diagnostic::operator<<(pDVar13,(pIVar2->definition->super_Symbol).name);
        pLVar17 = (LookupResult *)local_500;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_500._8_8_;
        local_500._0_16_ = auVar9 << 0x40;
        pAVar19 = (ArbitrarySymbolExpression *)
                  BumpAllocator::
                  emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                            (&compilation->super_BumpAllocator,(Expression **)pLVar17,
                             compilation->errorType);
        bVar10 = false;
      }
      else {
        bVar10 = true;
        local_550 = pIVar15;
      }
      if (bVar10) goto LAB_0041159f;
    }
    else {
      if (local_510 == (ArbitrarySymbolExpression *)0x0 || ((ulong)local_510 & 1) != 0) {
        SVar24 = (SourceRange)ZEXT816(0);
      }
      else {
        SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_510);
      }
      pDVar13 = ASTContext::addDiag(context,(DiagCode)0x14000a,SVar24);
      arg._M_str = local_548;
      arg._M_len = (size_t)local_530;
      Diagnostic::operator<<(pDVar13,arg);
      Diagnostic::operator<<(pDVar13,(pIVar2->definition->super_Symbol).name);
      Diagnostic::operator<<(pDVar13,(local_550->super_InstanceSymbolBase).super_Symbol.name);
      pLVar17 = (LookupResult *)local_500;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_500._8_8_;
      local_500._0_16_ = auVar8 << 0x40;
      pAVar19 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)pLVar17,
                           compilation->errorType);
    }
  }
  else {
    SVar1 = (pIVar15->super_InstanceSymbolBase).super_Symbol.kind;
    if (SVar1 == UninstantiatedDef) {
LAB_00411274:
      pLVar17 = (LookupResult *)(context->scope).ptr;
      pTVar12 = compilation->errorType;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_528.endLoc;
      local_528 = (SourceRange)(auVar7 << 0x40);
      local_500._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(local_518);
      pAVar19 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,decltype(nullptr),slang::SourceRange>
                          (&compilation->super_BumpAllocator,(Scope *)pLVar17,local_540,pTVar12,
                           (void **)&local_528,(SourceRange *)local_500);
    }
    else {
      if (SVar1 == Variable) {
        pTVar12 = DeclaredType::getType
                            ((DeclaredType *)&(pIVar15->super_InstanceSymbolBase).arrayPath);
        if (pTVar12->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar12);
        }
        if ((pTVar12->canonical->super_Symbol).kind == ErrorType) goto LAB_00411274;
      }
      pSVar11 = local_540;
      if (((char)local_534 != '\0') && ((local_540->name)._M_len != 0)) {
        SVar24 = slang::syntax::SyntaxNode::sourceRange(local_518);
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0x26000a,SVar24);
        pDVar13 = Diagnostic::operator<<(pDVar13,pSVar11->name);
        pLVar17 = (LookupResult *)0x50001;
        Diagnostic::addNote(pDVar13,(DiagCode)0x50001,pSVar11->location);
      }
      pAVar19 = (ArbitrarySymbolExpression *)0x0;
    }
  }
LAB_0041167d:
  if ((LookupResult *)local_4b8._0_8_ != (LookupResult *)(local_4b8 + 0x18)) {
    operator_delete((void *)local_4b8._0_8_);
  }
LAB_0041169f:
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_130,(EVP_PKEY_CTX *)pLVar17);
  if (local_188.data_ != (pointer)local_188.firstElement) {
    operator_delete(local_188.data_);
  }
  if ((Symbol *)local_278._24_8_ != (Symbol *)(local_278 + 0x30)) {
    operator_delete((void *)local_278._24_8_);
  }
  return &pAVar19->super_Expression;
}

Assistant:

Expression* Expression::tryBindInterfaceRef(const ASTContext& context,
                                            const ExpressionSyntax& syntax, bool isInterfacePort) {
    // Unwrap the expression; parentheses are superfluous.
    const ExpressionSyntax* expr = &syntax;
    while (expr->kind == SyntaxKind::ParenthesizedExpression)
        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

    // Connection must be a name (not some arbitrary expression).
    if (!NameSyntax::isKind(expr->kind)) {
        if (isInterfacePort)
            context.addDiag(diag::InterfacePortInvalidExpression, expr->sourceRange());
        return nullptr;
    }

    // Try to look up that name.
    LookupResult result;
    auto flags = isInterfacePort ? LookupFlags::IfacePortConn : LookupFlags::None;
    Lookup::name(expr->as<NameSyntax>(), context, flags, result);

    DeferredSourceRange modportRange;
    std::string_view arrayModportName;
    if (!result.found) {
        // We didn't find the name as-is. This might be a case where the user has
        // provided an explicit modport name on top of an array of interfaces,
        // which we should support by looking up the name again without the trailing
        // name component and taking the result if it's an iface array.
        if (expr->kind == SyntaxKind::ScopedName) {
            auto& scoped = expr->as<ScopedNameSyntax>();
            if (scoped.separator.kind == TokenKind::Dot &&
                scoped.right->kind == SyntaxKind::IdentifierName) {
                LookupResult result2;
                Lookup::name(*scoped.left, context, LookupFlags::None, result2);
                arrayModportName = scoped.right->as<IdentifierNameSyntax>().identifier.valueText();

                auto found = result2.found;
                if (found && !arrayModportName.empty() &&
                    (found->kind == SymbolKind::InterfacePort ||
                     found->kind == SymbolKind::InstanceArray)) {
                    result = result2;
                    modportRange = *scoped.right;
                }
            }
        }

        // If still not found we can't make a connection. Error if this is for a
        // port, and otherwise return null to let the caller try binding as a
        // normal expression.
        if (!result.found) {
            if (isInterfacePort)
                result.reportDiags(context);
            return nullptr;
        }
    }

    auto& comp = context.getCompilation();
    auto symbol = result.found;
    const InterfacePortSymbol* ifacePort = nullptr;
    const ModportSymbol* modport = nullptr;

    // If we found an interface port we should unwrap to what it's connected to.
    if (symbol->kind == SymbolKind::InterfacePort) {
        result.flags |= LookupResultFlags::IfacePort;
        result.path.emplace_back(*symbol);

        ifacePort = &symbol->as<InterfacePortSymbol>();
        std::tie(symbol, modport) = ifacePort->getConnection();

        if (symbol && !result.selectors.empty()) {
            SmallVector<const ElementSelectSyntax*> selectors;
            for (auto& sel : result.selectors)
                selectors.push_back(std::get<0>(sel));

            symbol = Lookup::selectChild(*symbol, selectors, context, result);
            result.selectors.clear();
        }

        if (!symbol) {
            // Returning nullptr from this function means to try doing normal expression
            // creation, but if we hit this case here we found the iface and simply failed
            // to connect it, likely because we're in an uninstantiated context. Return
            // a badExpr here to silence any follow on errors that might otherwise result.
            result.reportDiags(context);
            return &badExpr(comp, nullptr);
        }
    }

    // Unwrap any interface arrays we found, collect the dimensions along the way.
    SmallVector<ConstantRange, 4> dims;
    auto origSymbol = symbol;
    while (symbol->kind == SymbolKind::InstanceArray) {
        auto& array = symbol->as<InstanceArraySymbol>();
        if (array.elements.empty())
            return &badExpr(comp, nullptr);

        dims.push_back(array.range);
        symbol = array.elements[0];
    }

    // If we didn't find a modport or an interface instance then this is not
    // an interface connection.
    if (symbol->kind != SymbolKind::Modport &&
        (symbol->kind != SymbolKind::Instance || !symbol->as<InstanceSymbol>().isInterface())) {
        // If this is a variable with an errored type, an error is already emitted.
        if (symbol->kind == SymbolKind::UninstantiatedDef ||
            (symbol->kind == SymbolKind::Variable &&
             symbol->as<VariableSymbol>().getType().isError())) {
            return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol,
                                                           comp.getErrorType(), nullptr,
                                                           syntax.sourceRange());
        }

        if (isInterfacePort && !origSymbol->name.empty()) {
            auto& diag = context.addDiag(diag::NotAnInterface, syntax.sourceRange())
                         << origSymbol->name;
            diag.addNote(diag::NoteDeclarationHere, origSymbol->location);
        }

        // Return nullptr to let the parent try normal expression binding.
        return nullptr;
    }

    // At this point we've found a connection so we're no longer speculatively
    // trying to connect, we're going to connect or issue an error.
    result.reportDiags(context);
    result.errorIfSelectors(context);

    auto sourceRange = syntax.sourceRange();
    const InstanceBodySymbol* iface = nullptr;
    if (symbol->kind == SymbolKind::Modport) {
        modport = &symbol->as<ModportSymbol>();
        iface = &symbol->getParentScope()->asSymbol().as<InstanceBodySymbol>();
    }
    else {
        iface = &symbol->as<InstanceSymbol>().body;
    }

    if (!isInterfacePort) {
        if (iface->hierarchyOverrideNode) {
            auto& diag = context.addDiag(diag::VirtualIfaceDefparam, sourceRange);
            if (auto source = findOverrideNodeSource(*iface->hierarchyOverrideNode))
                diag.addNote(diag::NoteDeclarationHere, source->sourceRange());
        }

        if (iface->parentInstance && iface->parentInstance->resolvedConfig) {
            auto& diag = context.addDiag(diag::VirtualIfaceConfigRule, sourceRange);

            auto rc = iface->parentInstance->resolvedConfig;
            if (rc->configRule)
                diag.addNote(diag::NoteConfigRule, rc->configRule->syntax->sourceRange());
            else
                diag.addNote(diag::NoteConfigRule, rc->useConfig.location);
        }
    }

    if (!arrayModportName.empty()) {
        if (modport) {
            // If we connected via an interface port that itself has a modport restriction,
            // we can't also be restricting via an interface array modport.
            auto& diag = context.addDiag(diag::InvalidModportAccess, *modportRange);
            diag << arrayModportName;
            diag << iface->getDefinition().name;
            diag << modport->name;
            return &badExpr(comp, nullptr);
        }
        else {
            auto sym = iface->find(arrayModportName);
            if (!sym || sym->kind != SymbolKind::Modport) {
                auto& diag = context.addDiag(diag::NotAModport, *modportRange);
                diag << arrayModportName;
                diag << iface->getDefinition().name;
                return &badExpr(comp, nullptr);
            }

            modport = &sym->as<ModportSymbol>();
        }
    }

    // Now make sure the interface or modport we found matches the target type.
    // Fabricate a virtual interface type for the rhs that we can use for matching.
    SLANG_ASSERT(iface->parentInstance);
    const Type* type = comp.emplace<VirtualInterfaceType>(*iface->parentInstance, modport,
                                                          /* isRealIface */ true,
                                                          sourceRange.start());
    if (!dims.empty())
        type = &FixedSizeUnpackedArrayType::fromDims(*context.scope, *type, dims, sourceRange);

    // Don't return a modport as the symbol target, it's expected that it
    // will be pulled from the virtual interface type instead.
    if (origSymbol->kind == SymbolKind::Modport) {
        origSymbol = &origSymbol->getParentScope()->asSymbol();
        origSymbol = origSymbol->as<InstanceBodySymbol>().parentInstance;
    }

    auto hierRef = HierarchicalReference::fromLookup(comp, result);
    return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol, *type, &hierRef,
                                                   sourceRange);
}